

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O1

void __thiscall llvm::SourceMgr::SrcBuffer::~SrcBuffer(SrcBuffer *this)

{
  ulong uVar1;
  void *pvVar2;
  _Head_base<0UL,_llvm::MemoryBuffer_*,_false> _Var3;
  int iVar4;
  char *__function;
  pointer *__ptr;
  undefined8 *puVar5;
  
  uVar1 = (this->OffsetCache).Val.Val.Value;
  if (7 < uVar1) {
    if ((uVar1 & 6) != 0) {
      iVar4 = (int)(uVar1 & 6);
      if (((uint)uVar1 & 6) == 4) {
        if (iVar4 != 4) {
          __function = 
          "T llvm::PointerUnion4<std::vector<unsigned char> *, std::vector<unsigned short> *, std::vector<unsigned int> *, std::vector<unsigned long> *>::get() const [PT1 = std::vector<unsigned char> *, PT2 = std::vector<unsigned short> *, PT3 = std::vector<unsigned int> *, PT4 = std::vector<unsigned long> *, T = std::vector<unsigned short> *]"
          ;
LAB_001cc7a6:
          __assert_fail("is<T>() && \"Invalid accessor called\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/PointerUnion.h"
                        ,0x189,__function);
        }
      }
      else if ((iVar4 != 6) && (iVar4 != 2)) {
        __function = 
        "T llvm::PointerUnion4<std::vector<unsigned char> *, std::vector<unsigned short> *, std::vector<unsigned int> *, std::vector<unsigned long> *>::get() const [PT1 = std::vector<unsigned char> *, PT2 = std::vector<unsigned short> *, PT3 = std::vector<unsigned int> *, PT4 = std::vector<unsigned long> *, T = std::vector<unsigned long> *]"
        ;
        goto LAB_001cc7a6;
      }
    }
    puVar5 = (undefined8 *)(uVar1 & 0xfffffffffffffff8);
    if (puVar5 != (undefined8 *)0x0) {
      pvVar2 = (void *)*puVar5;
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,puVar5[2] - (long)pvVar2);
      }
      operator_delete(puVar5,0x18);
    }
    (this->OffsetCache).Val.Val.Value = 0;
  }
  _Var3._M_head_impl =
       (this->Buffer)._M_t.
       super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
       super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
       super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (MemoryBuffer *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_MemoryBuffer + 8))();
  }
  (this->Buffer)._M_t.
  super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
  super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
  super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl = (MemoryBuffer *)0x0;
  return;
}

Assistant:

SourceMgr::SrcBuffer::~SrcBuffer() {
  if (!OffsetCache.isNull()) {
    if (OffsetCache.is<std::vector<uint8_t>*>())
      delete OffsetCache.get<std::vector<uint8_t>*>();
    else if (OffsetCache.is<std::vector<uint16_t>*>())
      delete OffsetCache.get<std::vector<uint16_t>*>();
    else if (OffsetCache.is<std::vector<uint32_t>*>())
      delete OffsetCache.get<std::vector<uint32_t>*>();
    else
      delete OffsetCache.get<std::vector<uint64_t>*>();
    OffsetCache = nullptr;
  }
}